

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tiled_Image.cxx
# Opt level: O0

int __thiscall Fl_Tiled_Image::copy(Fl_Tiled_Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  int H_local;
  int W_local;
  Fl_Tiled_Image *this_local;
  
  iVar1 = Fl_Image::w(&this->super_Fl_Image);
  if (((int)dst != iVar1) ||
     (iVar1 = Fl_Image::h(&this->super_Fl_Image), this_local = this, (int)src != iVar1)) {
    this_local = (Fl_Tiled_Image *)operator_new(0x38);
    Fl_Tiled_Image(this_local,this->image_,(int)dst,(int)src);
  }
  return (int)this_local;
}

Assistant:

Fl_Image *			// O - New image
Fl_Tiled_Image::copy(int W,	// I - New width
                     int H) {	// I - New height
  if (W == w() && H == h()) return this;
  else return new Fl_Tiled_Image(image_, W, H);
}